

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O3

int If_CutSopBalanceEvalInt
              (Vec_Int_t *vCover,int *pTimes,int *pFaninLits,Vec_Int_t *vAig,int *piRes,int nSuppAll
              ,int *pArea)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint *puVar14;
  ulong uVar15;
  int nCounterOr;
  int pCounterAnd [15];
  int pFaninLitsAnd [15];
  int pCounterOr [70];
  int pFaninLitsOr [70];
  int in_stack_fffffffffffffcd0;
  int local_32c;
  int nSuppAll_00;
  int local_324;
  Vec_Int_t *local_320;
  ulong local_318;
  long local_310;
  int *local_308;
  int *local_300;
  uint local_2f8 [18];
  uint *local_2b0;
  int local_2a8 [16];
  uint local_268 [72];
  int local_148 [70];
  
  if (0x46 < vCover->nSize) {
    return -1;
  }
  local_2b0 = (uint *)piRes;
  local_324 = 0;
  local_308 = pFaninLits;
  local_300 = pTimes;
  if (0 < vCover->nSize) {
    uVar15 = (ulong)(uint)nSuppAll;
    lVar7 = 0;
    uVar2 = 0;
    local_320 = vCover;
    local_318 = uVar15;
    nSuppAll_00 = nSuppAll;
    do {
      iVar5 = local_320->pArray[lVar7];
      local_32c = 0;
      local_310 = lVar7;
      if (nSuppAll_00 < 1) {
LAB_004232e8:
        __assert_fail("nCounterAnd > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                      ,0xd5,
                      "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                     );
      }
      uVar10 = 0;
      iVar11 = 0;
      nSuppAll_00 = nSuppAll;
      do {
        iVar12 = iVar11;
        switch(iVar5 >> ((char)uVar10 * '\x02' & 0x1fU) & 3) {
        case 1:
          iVar12 = iVar11 + 1;
          if (vAig == (Vec_Int_t *)0x0) {
            uVar8 = (ulong)local_32c;
            iVar3 = local_32c + 1;
            local_2f8[uVar8] = local_300[uVar10];
            if (0 < (long)uVar8) {
              do {
                uVar13 = uVar8 & 0xffffffff;
                uVar2 = local_2f8[uVar13];
                iVar12 = (int)uVar8;
                uVar9 = (ulong)(iVar12 - 1);
                uVar4 = local_2f8[uVar9];
                piRes = (int *)(ulong)uVar4;
                if ((int)uVar2 < (int)uVar4) break;
                if ((int)uVar4 < (int)uVar2) {
                  local_2f8[uVar13] = uVar4;
                  local_2f8[uVar9] = uVar2;
                }
                else {
                  piRes = (int *)(ulong)(uVar4 + 1);
                  local_2f8[uVar9] = uVar4 + 1;
                  iVar3 = iVar3 + -1;
                  if (iVar12 < iVar3) {
                    puVar14 = local_2f8 + uVar13 + 1;
                    uVar8 = uVar8 & 0xffffffff;
                    do {
                      piRes = (int *)(ulong)*puVar14;
                      puVar14[-1] = *puVar14;
                      puVar14 = puVar14 + 1;
                      uVar2 = (int)uVar8 + 1;
                      uVar8 = (ulong)uVar2;
                    } while ((int)uVar2 < iVar3);
                  }
                }
                uVar8 = uVar9;
              } while (1 < iVar12);
            }
LAB_004230bb:
            iVar12 = iVar11 + 1;
            if (iVar3 < 1) goto LAB_004232aa;
            uVar2 = (iVar3 != 1) + local_2f8[0];
            local_32c = iVar3;
          }
          else {
            if (local_308[uVar10] < 0) goto LAB_004232c9;
            uVar2 = local_308[uVar10] ^ 1;
            piRes = (int *)(ulong)uVar2;
            uVar2 = If_LogCounterAddAig((int *)local_2f8,&local_32c,local_2a8,local_300[uVar10],
                                        uVar2,vAig,nSuppAll_00,in_stack_fffffffffffffcd0,nSuppAll_00
                                       );
            uVar15 = local_318;
          }
          break;
        case 2:
          iVar12 = iVar11 + 1;
          if (vAig == (Vec_Int_t *)0x0) {
            uVar8 = (ulong)local_32c;
            iVar3 = local_32c + 1;
            local_2f8[uVar8] = local_300[uVar10];
            if (0 < (long)uVar8) {
              do {
                uVar13 = uVar8 & 0xffffffff;
                uVar2 = local_2f8[uVar13];
                iVar12 = (int)uVar8;
                uVar9 = (ulong)(iVar12 - 1);
                uVar4 = local_2f8[uVar9];
                piRes = (int *)(ulong)uVar4;
                if ((int)uVar2 < (int)uVar4) break;
                if ((int)uVar4 < (int)uVar2) {
                  local_2f8[uVar13] = uVar4;
                  local_2f8[uVar9] = uVar2;
                }
                else {
                  piRes = (int *)(ulong)(uVar4 + 1);
                  local_2f8[uVar9] = uVar4 + 1;
                  iVar3 = iVar3 + -1;
                  if (iVar12 < iVar3) {
                    puVar14 = local_2f8 + uVar13 + 1;
                    uVar8 = uVar8 & 0xffffffff;
                    do {
                      piRes = (int *)(ulong)*puVar14;
                      puVar14[-1] = *puVar14;
                      puVar14 = puVar14 + 1;
                      uVar2 = (int)uVar8 + 1;
                      uVar8 = (ulong)uVar2;
                    } while ((int)uVar2 < iVar3);
                  }
                }
                uVar8 = uVar9;
              } while (1 < iVar12);
            }
            goto LAB_004230bb;
          }
          piRes = (int *)(ulong)(uint)local_308[uVar10];
          uVar2 = If_LogCounterAddAig((int *)local_2f8,&local_32c,local_2a8,local_300[uVar10],
                                      local_308[uVar10],vAig,nSuppAll_00,in_stack_fffffffffffffcd0,
                                      nSuppAll_00);
          uVar15 = local_318;
          break;
        case 3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                        ,0xd3,
                        "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                       );
        }
        uVar10 = uVar10 + 1;
        iVar11 = iVar12;
      } while (uVar10 != uVar15);
      if (local_32c < 1) goto LAB_004232e8;
      if (iVar12 < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                      ,0xd6,
                      "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                     );
      }
      nSuppAll = nSuppAll_00;
      if (vAig == (Vec_Int_t *)0x0) {
        *pArea = *pArea + iVar12 + -1;
        uVar10 = (ulong)local_324;
        iVar5 = local_324 + 1;
        local_268[uVar10] = uVar2;
        if (0 < (long)uVar10) {
          do {
            uVar9 = uVar10 & 0xffffffff;
            uVar2 = local_268[uVar9];
            iVar11 = (int)uVar10;
            uVar8 = (ulong)(iVar11 - 1);
            uVar4 = local_268[uVar8];
            piRes = (int *)(ulong)uVar4;
            if ((int)uVar2 < (int)uVar4) break;
            if ((int)uVar4 < (int)uVar2) {
              local_268[uVar9] = uVar4;
              local_268[uVar8] = uVar2;
            }
            else {
              piRes = (int *)(ulong)(uVar4 + 1);
              local_268[uVar8] = uVar4 + 1;
              iVar5 = iVar5 + -1;
              if (iVar11 < iVar5) {
                puVar14 = local_268 + uVar9 + 1;
                uVar10 = uVar10 & 0xffffffff;
                do {
                  piRes = (int *)(ulong)*puVar14;
                  puVar14[-1] = *puVar14;
                  puVar14 = puVar14 + 1;
                  uVar2 = (int)uVar10 + 1;
                  uVar10 = (ulong)uVar2;
                } while ((int)uVar2 < iVar5);
              }
            }
            uVar10 = uVar8;
          } while (1 < iVar11);
        }
        if (iVar5 < 1) {
LAB_004232aa:
          __assert_fail("nTimes > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCount.h"
                        ,0x77,
                        "int If_LogCounterAddAig(int *, int *, int *, int, int, Vec_Int_t *, int, int, int)"
                       );
        }
        uVar2 = (iVar5 != 1) + local_268[0];
        local_324 = iVar5;
      }
      else {
        uVar4 = If_LogCreateAndXorMulti(vAig,local_2a8,local_32c,nSuppAll_00,(int)piRes);
        if ((int)uVar4 < 0) goto LAB_004232c9;
        piRes = (int *)(ulong)(uVar4 ^ 1);
        uVar2 = If_LogCounterAddAig((int *)local_268,&local_324,local_148,uVar2,uVar4 ^ 1,vAig,
                                    nSuppAll_00,in_stack_fffffffffffffcd0,nSuppAll);
        uVar15 = local_318;
      }
      puVar14 = local_2b0;
      pVVar1 = local_320;
      lVar7 = local_310 + 1;
    } while (lVar7 < local_320->nSize);
    if (0 < local_324) {
      if (vAig == (Vec_Int_t *)0x0) {
        *pArea = local_320->nSize + *pArea + -1;
        return uVar2;
      }
      uVar4 = If_LogCreateAndXorMulti(vAig,local_148,local_324,nSuppAll_00,(int)piRes);
      if (-1 < (int)uVar4) {
        *puVar14 = uVar4 ^ 1;
        uVar6 = uVar4 ^ 1;
        if (((uint)pVVar1->nCap >> 0x10 & 1) != 0) {
          uVar6 = uVar4;
        }
        *puVar14 = uVar6;
        return uVar2;
      }
LAB_004232c9:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
  }
  __assert_fail("nCounterOr > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                ,0xdd,
                "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
               );
}

Assistant:

int If_CutSopBalanceEvalInt( Vec_Int_t * vCover, int * pTimes, int * pFaninLits, Vec_Int_t * vAig, int * piRes, int nSuppAll, int * pArea )
{
    int nCounterAnd, pCounterAnd[IF_MAX_FUNC_LUTSIZE], pFaninLitsAnd[IF_MAX_FUNC_LUTSIZE];
    int nCounterOr,  pCounterOr[IF_MAX_CUBES],  pFaninLitsOr[IF_MAX_CUBES];
    int i, k, Entry, Literal, nLits, Delay = 0, iRes = 0;
    if ( Vec_IntSize(vCover) > IF_MAX_CUBES )
        return -1;
    nCounterOr = 0;
    Vec_IntForEachEntry( vCover, Entry, i )
    { 
        nCounterAnd = nLits = 0;
        for ( k = 0; k < nSuppAll; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 ) // neg literal
                nLits++, Delay = If_LogCounterAddAig( pCounterAnd, &nCounterAnd, pFaninLitsAnd, pTimes[k], vAig ? Abc_LitNot(pFaninLits[k]) : -1, vAig, nSuppAll, 0, 0 );
            else if ( Literal == 2 ) // pos literal
                nLits++, Delay = If_LogCounterAddAig( pCounterAnd, &nCounterAnd, pFaninLitsAnd, pTimes[k], vAig ? pFaninLits[k] : -1, vAig, nSuppAll, 0, 0 );
            else if ( Literal != 0 ) 
                assert( 0 );
        }
        assert( nCounterAnd > 0 );
        assert( nLits > 0 );
        if ( vAig )
            iRes = If_LogCreateAndXorMulti( vAig, pFaninLitsAnd, nCounterAnd, nSuppAll, 0 );
        else
            *pArea += nLits == 1 ? 0 : nLits - 1;
        Delay = If_LogCounterAddAig( pCounterOr, &nCounterOr, pFaninLitsOr, Delay, vAig ? Abc_LitNot(iRes) : -1, vAig, nSuppAll, 0, 0 );
    }
    assert( nCounterOr > 0 );
    if ( vAig )
    {
        *piRes = Abc_LitNot( If_LogCreateAndXorMulti( vAig, pFaninLitsOr, nCounterOr, nSuppAll, 0 ) );
        if ( ((vCover->nCap >> 16) & 1) )  // hack to remember complemented attribute
            *piRes = Abc_LitNot( *piRes );
    }
    else       
        *pArea += Vec_IntSize(vCover) == 1 ? 0 : Vec_IntSize(vCover) - 1;
    return Delay;
}